

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_set_unvoiced_vowel.c
# Opt level: O0

void get_mora_information
               (NJDNode *node,int index,char **mora,NJDNode **nlink,int *flag,int *size,int *midx,
               int *atype)

{
  int iVar1;
  int iVar2;
  char *__s;
  size_t sVar3;
  char **in_RCX;
  undefined8 *in_RDX;
  int in_ESI;
  NJDNode *in_RDI;
  NJDNode **in_R8;
  int *in_R9;
  int *unaff_retaddr;
  int *in_stack_00000008;
  int *in_stack_00000010;
  int len;
  char *str;
  int matched_size;
  int i;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_fffffffffffffff0;
  
  __s = NJDNode_get_pron(in_RDI);
  sVar3 = strlen(__s);
  if (in_ESI < (int)sVar3) {
    *in_RCX = (char *)in_RDI;
    if ((in_ESI == 0) && (iVar1 = NJDNode_get_chain_flag(in_RDI), iVar1 != 1)) {
      *in_stack_00000008 = 0;
      iVar1 = NJDNode_get_acc(in_RDI);
      *in_stack_00000010 = iVar1;
    }
    iVar1 = strcmp(__s,anon_var_dwarf_b5067);
    if (iVar1 == 0) {
      *in_RDX = anon_var_dwarf_b5067;
      *(undefined4 *)in_R8 = 0;
      *in_R9 = 3;
    }
    else {
      iVar1 = strcmp(__s,anon_var_dwarf_99a + 0x12);
      if (iVar1 == 0) {
        *in_RDX = anon_var_dwarf_99a + 0x12;
        *(undefined4 *)in_R8 = 0;
        *in_R9 = 3;
      }
      else {
        *in_RDX = 0;
        *(undefined4 *)in_R8 = 0xffffffff;
        *in_R9 = 0;
        for (iVar1 = 0; njd_set_unvoiced_vowel_mora_list[iVar1] != (char *)0x0; iVar1 = iVar1 + 1) {
          iVar2 = strtopcmp(__s + in_ESI,njd_set_unvoiced_vowel_mora_list[iVar1]);
          if (0 < iVar2) {
            *in_RDX = njd_set_unvoiced_vowel_mora_list[iVar1];
            *in_R9 = iVar2;
            break;
          }
        }
        iVar1 = strtopcmp(__s + (in_ESI + *in_R9),anon_var_dwarf_b46bd);
        if (0 < iVar1) {
          *(undefined4 *)in_R8 = 1;
          *in_R9 = iVar1 + *in_R9;
        }
      }
    }
  }
  else if (in_RDI->next == (_NJDNode *)0x0) {
    *in_RDX = 0;
    *in_RCX = (char *)0x0;
    *(undefined4 *)in_R8 = 0xffffffff;
    *in_R9 = 0;
    *in_stack_00000008 = 0;
    *in_stack_00000010 = 0;
  }
  else {
    get_mora_information
              ((NJDNode *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(int)((ulong)in_RDX >> 0x20),
               in_RCX,in_R8,in_R9,
               (int *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),unaff_retaddr,
               in_stack_00000008);
  }
  return;
}

Assistant:

static void get_mora_information(NJDNode * node, int index, const char **mora, NJDNode ** nlink,
                                 int *flag, int *size, int *midx, int *atype)
{
   int i;
   int matched_size;
   const char *str = NJDNode_get_pron(node);
   int len = strlen(str);

   /* find next word */
   if (index >= len) {
      if (node->next != NULL) {
         get_mora_information(node->next, index - len, mora, nlink, flag, size, midx, atype);
      } else {
         *mora = NULL;
         *nlink = NULL;
         *flag = -1;
         *size = 0;
         *midx = 0;
         *atype = 0;
      }
      return;
   }

   *nlink = node;

   /* reset mora index and accent type for new word */
   if (index == 0 && NJDNode_get_chain_flag(node) != 1) {
      *midx = 0;
      *atype = NJDNode_get_acc(node);
   }

   /* special symbol */
   if (strcmp(str, NJD_SET_UNVOICED_VOWEL_TOUTEN) == 0) {
      *mora = NJD_SET_UNVOICED_VOWEL_TOUTEN;
      *flag = 0;
      *size = strlen(NJD_SET_UNVOICED_VOWEL_TOUTEN);
      return;
   }
   if (strcmp(str, NJD_SET_UNVOICED_VOWEL_QUESTION) == 0) {
      *mora = NJD_SET_UNVOICED_VOWEL_QUESTION;
      *flag = 0;
      *size = strlen(NJD_SET_UNVOICED_VOWEL_QUESTION);
      return;
   }

   /* reset */
   *mora = NULL;
   *flag = -1;
   *size = 0;

   /* get mora */
   for (i = 0; njd_set_unvoiced_vowel_mora_list[i] != NULL; i++) {
      matched_size = strtopcmp(&str[index], njd_set_unvoiced_vowel_mora_list[i]);
      if (matched_size > 0) {
         *mora = njd_set_unvoiced_vowel_mora_list[i];
         *size = matched_size;
         break;
      }
   }

   /* get unvoice flag */
   matched_size = strtopcmp(&str[index + (*size)], NJD_SET_UNVOICED_VOWEL_QUOTATION);
   if (matched_size > 0) {
      *flag = 1;
      *size += matched_size;
   }
}